

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyPureVector.h
# Opt level: O1

void __thiscall
PartialJointPolicyPureVector::PartialJointPolicyPureVector
          (PartialJointPolicyPureVector *this,PartialJointPolicyPureVector *a)

{
  JointPolicyDiscretePure::JointPolicyDiscretePure
            ((JointPolicyDiscretePure *)this,(JointPolicyDiscretePure *)a);
  (this->super_PartialJointPolicyDiscretePure).super_PartialJointPolicy._m_pastReward =
       (a->super_PartialJointPolicyDiscretePure).super_PartialJointPolicy._m_pastReward;
  (this->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
  super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
       (_func_int **)&PTR_operator__005aef08;
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            (&this->super_JPolComponent_VectorImplementation,
             &a->super_JPolComponent_VectorImplementation);
  (this->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
  super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
       (_func_int **)&PTR_operator__005af018;
  (this->super_JPolComponent_VectorImplementation)._vptr_JPolComponent_VectorImplementation =
       (_func_int **)&DAT_005af0f8;
  return;
}

Assistant:

PartialJointPolicyPureVector(const PartialJointPolicyPureVector& a)
            :
            PartialJointPolicyDiscretePure(a)
            , JPolComponent_VectorImplementation(a)
        {}